

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_OBSOLETE_V5_DimExtra * AnnotationExtension(ON_OBSOLETE_V5_Annotation *pDim,bool bCreate)

{
  bool bVar1;
  ON_OBSOLETE_V5_DimExtra *pOVar2;
  ON_OBSOLETE_V5_DimExtra *pOVar3;
  ON_UUID local_30;
  
  if (pDim != (ON_OBSOLETE_V5_Annotation *)0x0) {
    local_30 = ON_ClassId::Uuid(&ON_OBSOLETE_V5_DimExtra::m_ON_OBSOLETE_V5_DimExtra_class_rtti);
    pOVar2 = (ON_OBSOLETE_V5_DimExtra *)ON_Object::GetUserData((ON_Object *)pDim,&local_30);
    if (pOVar2 == (ON_OBSOLETE_V5_DimExtra *)0x0) {
      pOVar3 = (ON_OBSOLETE_V5_DimExtra *)0x0;
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar2,
                                  &ON_OBSOLETE_V5_DimExtra::m_ON_OBSOLETE_V5_DimExtra_class_rtti);
      pOVar3 = (ON_OBSOLETE_V5_DimExtra *)0x0;
      if (bVar1) {
        pOVar3 = pOVar2;
      }
    }
    if (!bCreate || pOVar3 != (ON_OBSOLETE_V5_DimExtra *)0x0) {
      return pOVar3;
    }
    pOVar2 = (ON_OBSOLETE_V5_DimExtra *)operator_new(0x118);
    ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra(pOVar2);
    bVar1 = ON_Object::AttachUserData((ON_Object *)pDim,(ON_UserData *)pOVar2);
    if (bVar1) {
      return pOVar2;
    }
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  return (ON_OBSOLETE_V5_DimExtra *)0x0;
}

Assistant:

static ON_OBSOLETE_V5_DimExtra* AnnotationExtension(ON_OBSOLETE_V5_Annotation* pDim, bool bCreate)
{
  ON_OBSOLETE_V5_DimExtra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_OBSOLETE_V5_DimExtra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra)));
    if(pExtra == 0 && bCreate)
    {
      pExtra = new ON_OBSOLETE_V5_DimExtra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}